

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O0

bool __thiscall csv::icu::DataSource::is_eol(DataSource *this)

{
  uint uVar1;
  DataSource *this_local;
  
  if (this->_current == 0xd) {
    uVar1 = (*(this->super_IDataSource)._vptr_IDataSource[2])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      if (this->_current != 10) {
        (*(this->super_IDataSource)._vptr_IDataSource[3])();
      }
      this_local._7_1_ = true;
    }
  }
  else if (this->_current == 10) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DataSource::is_eol() {
		if (_current == '\r') {
			if (next() == false) {
				// Hit the end of file.  Return true and let the caller handle it
				return true;
			}

			if (_current != '\n') {
				back();
			}
			return true;
		}
		else if (_current == '\n') {
			return true;
		}
		return false;
	}